

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Embed.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeEmbed(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  bool bVar2;
  int iVar3;
  uint index_00;
  string *psVar4;
  string *layerType;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  reference __x;
  BlobProto *pBVar6;
  BlobShape *pBVar7;
  ulong uVar8;
  int64 iVar9;
  WeightParams *pWVar10;
  RepeatedField<float> *other;
  NetParameter *in_stack_00000008;
  float local_61c;
  RepeatedField<float> *local_618;
  RepeatedField<float> *biasWrite;
  string local_608;
  string local_5e8;
  string local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  float local_528;
  uint local_524;
  uint local_520;
  uint32_t dataIndex;
  uint32_t index;
  uint32_t c;
  uint32_t r;
  RepeatedField<float> *weightsWrite;
  string local_500;
  string local_4e0;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  uint local_420;
  uint local_41c;
  int caffeBlobSizeWeights;
  uint32_t blobSize;
  EmbeddingLayerParams *specLayerParams;
  string local_408;
  string local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  allocator local_321;
  string local_320;
  string local_300;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  int local_100;
  byte local_f9;
  int caffeBiasLength;
  uint32 uStack_f4;
  bool hasBias;
  uint32_t outputChannels;
  uint32_t inputChannels;
  EmbedParameter *caffeLayerParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *topName;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *bottomName;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  allocator local_61;
  string local_60;
  NeuralNetworkLayer *local_40;
  NeuralNetworkLayer *specLayer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayerWeights;
  LayerParameter *pLStack_18;
  int layerIdWeights;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  pLStack_18 = caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  caffeLayerWeights._4_4_ =
       getLayerIndex(pLStack_18,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)layerParameters.mappingDataBlobNames);
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(layerParameters.prototxt,caffeLayerWeights._4_4_);
  nnWrite = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)layerParameters._24_8_;
  specLayer = (NeuralNetworkLayer *)layerParameters.protoweights;
  local_40 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                       ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                        layerParameters.protoweights);
  iVar3 = caffe::LayerParameter::bottom_size(pLStack_18);
  if (iVar3 == 1) {
    iVar3 = caffe::LayerParameter::top_size(pLStack_18);
    if (iVar3 == 1) goto LAB_00722f63;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"Must have 1 input and 1 output",&local_61);
  psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
  layerType = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
  errorInCaffeProto(&local_60,psVar4,layerType);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
LAB_00722f63:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  pRVar5 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18);
  __end1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(pRVar5);
  bottomName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(pRVar5);
  while( true ) {
    bVar2 = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__end1,(iterator *)&bottomName);
    if (!bVar2) break;
    __x = google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pRVar5 = caffe::LayerParameter::top_abi_cxx11_(pLStack_18);
  __end1_1 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(pRVar5);
  topName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::end(pRVar5);
  while( true ) {
    bVar2 = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__end1_1,(iterator *)&topName);
    if (!bVar2) break;
    caffeLayerParams =
         (EmbedParameter *)
         google::protobuf::internal::
         RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,(value_type *)caffeLayerParams);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
  convertCaffeMetadata
            (psVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&top.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)nnWrite);
  _outputChannels = caffe::LayerParameter::embed_param(pLStack_18);
  uStack_f4 = caffe::EmbedParameter::input_dim(_outputChannels);
  caffeBiasLength = caffe::EmbedParameter::num_output(_outputChannels);
  local_f9 = caffe::EmbedParameter::bias_term(_outputChannels);
  local_100 = 0;
  iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames);
  if (1 < iVar3) {
    pBVar6 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,1);
    local_100 = caffe::BlobProto::data_size(pBVar6);
  }
  iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames);
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"Weight blobs not provided",&local_121);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"Embed",&local_149);
    errorInCaffeProto(&local_120,psVar4,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  if (((local_f9 & 1) != 0) && (local_100 == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_170,
               "Expected bias parameters when \'bias_term\' flag is set to True.",&local_171);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"Embed",&local_199);
    errorInCaffeProto(&local_170,psVar4,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  if (((local_f9 & 1) == 0) && (0 < local_100)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1c0,"Found bias parameters even though \'bias_term\' flag is False",
               &local_1c1);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"Embed",&local_1e9);
    errorInCaffeProto(&local_1c0,psVar4,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  pBVar6 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
  pBVar7 = caffe::BlobProto::shape(pBVar6);
  iVar3 = caffe::BlobShape::dim_size(pBVar7);
  if (iVar3 != 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210,"Weight blob dim size is not 2",&local_211);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_238,"Embed",&local_239);
    errorInCaffeProto(&local_210,psVar4,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
  }
  pBVar6 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
  pBVar7 = caffe::BlobProto::shape(pBVar6);
  uVar8 = caffe::BlobShape::dim(pBVar7,1);
  if (uVar8 != (uint)caffeBiasLength) {
    std::__cxx11::to_string(&local_2e0,caffeBiasLength);
    std::operator+(&local_2c0,"num_output(",&local_2e0);
    std::operator+(&local_2a0,&local_2c0,
                   ") does not match the second dimension of the weight matrix(");
    pBVar6 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar7 = caffe::BlobProto::shape(pBVar6);
    iVar9 = caffe::BlobShape::dim(pBVar7,1);
    std::__cxx11::to_string(&local_300,iVar9);
    std::operator+(&local_280,&local_2a0,&local_300);
    std::operator+(&local_260,&local_280,")");
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_320,"Embed",&local_321);
    errorInCaffeProto(&local_260,psVar4,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  pBVar6 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
  pBVar7 = caffe::BlobProto::shape(pBVar6);
  uVar8 = caffe::BlobShape::dim(pBVar7,0);
  if (uVar8 != uStack_f4) {
    std::__cxx11::to_string(&local_3c8,uStack_f4);
    std::operator+(&local_3a8,"input_dim(",&local_3c8);
    std::operator+(&local_388,&local_3a8,
                   ") does not match the first dimension of the weight matrix(");
    pBVar6 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar7 = caffe::BlobProto::shape(pBVar6);
    iVar9 = caffe::BlobShape::dim(pBVar7,0);
    std::__cxx11::to_string(&local_3e8,iVar9);
    std::operator+(&local_368,&local_388,&local_3e8);
    std::operator+(&local_348,&local_368,")");
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_408,"Embed",(allocator *)((long)&specLayerParams + 7));
    errorInCaffeProto(&local_348,psVar4,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)((long)&specLayerParams + 7));
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
  }
  _caffeBlobSizeWeights = CoreML::Specification::NeuralNetworkLayer::mutable_embedding(local_40);
  CoreML::Specification::EmbeddingLayerParams::set_inputdim(_caffeBlobSizeWeights,(ulong)uStack_f4);
  CoreML::Specification::EmbeddingLayerParams::set_outputchannels
            (_caffeBlobSizeWeights,(ulong)(uint)caffeBiasLength);
  CoreML::Specification::EmbeddingLayerParams::set_hasbias
            (_caffeBlobSizeWeights,(bool)(local_f9 & 1));
  local_41c = uStack_f4 * caffeBiasLength;
  pBVar6 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
  local_420 = caffe::BlobProto::data_size(pBVar6);
  if (((int)local_420 < 0) || (local_420 != local_41c)) {
    std::__cxx11::to_string(&local_4c0,local_41c);
    std::operator+(&local_4a0,"Expected blob size = ",&local_4c0);
    std::operator+(&local_480,&local_4a0," but found blob of size = ");
    std::__cxx11::to_string(&local_4e0,local_420);
    std::operator+(&local_460,&local_480,&local_4e0);
    std::operator+(&local_440,&local_460," in caffe");
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_500,"Inner Product",(allocator *)((long)&weightsWrite + 7));
    errorInCaffeProto(&local_440,psVar4,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator((allocator<char> *)((long)&weightsWrite + 7));
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
  }
  pWVar10 = CoreML::Specification::EmbeddingLayerParams::mutable_weights(_caffeBlobSizeWeights);
  _r = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  if (0x7fffffff < local_41c) {
    __assert_fail("blobSize <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                  ,0x5d,
                  "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  c = 0;
  google::protobuf::RepeatedField<float>::Resize(_r,local_41c,(float *)&c);
  index = 0;
  do {
    if ((uint)caffeBiasLength <= index) {
      if ((local_f9 & 1) != 0) {
        if ((local_100 < 0) || (local_100 != caffeBiasLength)) {
          std::__cxx11::to_string(&local_5c8,caffeBiasLength);
          std::operator+(&local_5a8,"Expected blob size = ",&local_5c8);
          std::operator+(&local_588,&local_5a8," but found blob of size = ");
          std::__cxx11::to_string(&local_5e8,local_100);
          std::operator+(&local_568,&local_588,&local_5e8);
          std::operator+(&local_548,&local_568," in caffe");
          psVar4 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_608,"Inner Product",(allocator *)((long)&biasWrite + 7));
          errorInCaffeProto(&local_548,psVar4,&local_608);
          std::__cxx11::string::~string((string *)&local_608);
          std::allocator<char>::~allocator((allocator<char> *)((long)&biasWrite + 7));
          std::__cxx11::string::~string((string *)&local_548);
          std::__cxx11::string::~string((string *)&local_568);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        pWVar10 = CoreML::Specification::EmbeddingLayerParams::mutable_bias(_caffeBlobSizeWeights);
        local_618 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
        if (0x7fffffff < (uint)caffeBiasLength) {
          __assert_fail("outputChannels <= INT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                        ,0x71,
                        "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        local_61c = 0.0;
        google::protobuf::RepeatedField<float>::Resize(local_618,caffeBiasLength,&local_61c);
        pRVar1 = local_618;
        pBVar6 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,1);
        other = caffe::BlobProto::data(pBVar6);
        google::protobuf::RepeatedField<float>::CopyFrom(pRVar1,other);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    for (dataIndex = 0; pRVar1 = _r, dataIndex < uStack_f4; dataIndex = dataIndex + 1) {
      index_00 = index * uStack_f4 + dataIndex;
      local_520 = index_00;
      if (0x7fffffff < index_00) {
        __assert_fail("index <= INT_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                      ,0x62,
                      "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      local_524 = dataIndex * caffeBiasLength + index;
      if (0x7fffffff < local_524) {
        __assert_fail("dataIndex <= INT_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                      ,100,
                      "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      pBVar6 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      local_528 = caffe::BlobProto::data(pBVar6,local_524);
      google::protobuf::RepeatedField<float>::Set(pRVar1,index_00,&local_528);
    }
    index = index + 1;
  } while( true );
}

Assistant:

void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::EmbedParameter& caffeLayerParams = caffeLayer.embed_param();
    
    uint32_t inputChannels = caffeLayerParams.input_dim();
    uint32_t outputChannels = caffeLayerParams.num_output();
    bool hasBias = caffeLayerParams.bias_term();
    int caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto("Weight blobs not provided", caffeLayer.name(), "Embed");
    }
    if (hasBias && caffeBiasLength == 0){
        CoreMLConverter::errorInCaffeProto("Expected bias parameters when 'bias_term' flag is set to True.", caffeLayer.name(), "Embed");
    }
    if (!hasBias && caffeBiasLength > 0) {
        CoreMLConverter::errorInCaffeProto("Found bias parameters even though 'bias_term' flag is False", caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim_size() != 2){
        CoreMLConverter::errorInCaffeProto("Weight blob dim size is not 2", caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim(1) != outputChannels){
        CoreMLConverter::errorInCaffeProto("num_output("+std::to_string(outputChannels)+") does not match the second dimension of the weight matrix("+std::to_string(caffeLayerWeights.blobs(0).shape().dim(1))+")"
                                          ,caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim(0) != inputChannels){
        CoreMLConverter::errorInCaffeProto("input_dim("+std::to_string(inputChannels)+") does not match the first dimension of the weight matrix("+std::to_string(caffeLayerWeights.blobs(0).shape().dim(0))+")"
                                          ,caffeLayer.name(), "Embed");
    }
    //**************************************************************
    
    Specification::EmbeddingLayerParams* specLayerParams = specLayer->mutable_embedding();
    specLayerParams->set_inputdim(inputChannels);
    specLayerParams->set_outputchannels(outputChannels);
    specLayerParams->set_hasbias(hasBias);
    
    // Write weights: need to transpose
    // Caffe embed weights are stored as [inputChannels,outputChannels]
    // CoreML needs in the format: [outputChannels,inputChannels]
    uint32_t blobSize = inputChannels*outputChannels;
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSizeWeights < 0 ||
        static_cast<uint32_t>(caffeBlobSizeWeights) != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string(caffeBlobSizeWeights)+" in caffe"
                                          , caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* weightsWrite = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weightsWrite->Resize(static_cast<int>(blobSize), 0.0);
    for (uint32_t r=0; r<outputChannels; r++){
        for (uint32_t c=0; c<inputChannels; c++){
            uint32_t index = r*inputChannels+c;
            assert(index <= INT_MAX);
            uint32_t dataIndex = c*outputChannels+r;
            assert(dataIndex <= INT_MAX);
            weightsWrite->Set(static_cast<int>(index), caffeLayerWeights.blobs(0).data(static_cast<int>(dataIndex)));
        }
    }
    
    // Write bias
    if (hasBias) {
        if (caffeBiasLength < 0 ||
            static_cast<uint32_t>(caffeBiasLength) != outputChannels) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                                              , caffeLayer.name(), "Inner Product");
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        biasWrite->Resize(static_cast<int>(outputChannels), 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
    }

}